

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O3

void CreateBackwardReferencesNH55
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command_conflict *commands,
               size_t *num_commands,size_t *num_literals,
               BackwardReferenceFromDecoder *backward_references,size_t *back_refs_position,
               size_t back_refs_size)

{
  ulong uVar1;
  uint8_t *puVar2;
  long lVar3;
  ulong uVar4;
  byte bVar5;
  uint32_t uVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  ushort uVar11;
  int iVar12;
  ulong uVar13;
  byte bVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ushort uVar26;
  int iVar27;
  size_t sVar28;
  uint8_t *puVar29;
  ulong uVar30;
  uint8_t uVar31;
  ulong uVar32;
  long lVar33;
  ulong uVar34;
  size_t sVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  uint32_t uVar39;
  ulong uVar40;
  long lVar41;
  long lVar42;
  ulong local_140;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  size_t *local_100;
  ulong local_f0;
  ulong local_c8;
  ulong auStack_58 [5];
  
  uVar4 = (position - 7) + num_bytes;
  sVar35 = position;
  if (7 < num_bytes) {
    sVar35 = uVar4;
  }
  lVar41 = 0x200;
  if (*(int *)(literal_context_lut + 4) < 9) {
    lVar41 = 0x40;
  }
  local_110 = *(ulong *)dist_cache;
  uVar1 = position + num_bytes;
  if (uVar1 <= position + 8) {
    local_100 = last_insert_len;
LAB_0011e6e7:
    *(ulong *)dist_cache = (local_110 + uVar1) - position;
    *(long *)commands = *(long *)commands + ((long)local_100 - (long)last_insert_len >> 4);
    return;
  }
  uVar38 = (1L << (literal_context_lut[8] & 0x3f)) - 0x10;
  lVar8 = *(long *)(literal_context_lut + 0x10);
  local_c8 = lVar41 + position;
  lVar9 = *(long *)&(params->hasher).num_last_distances_to_check;
  uVar10 = (uint)ringbuffer_mask;
  lVar3 = position - 1;
  local_100 = last_insert_len;
  sVar28 = position;
LAB_0011d882:
  uVar21 = uVar1 - sVar28;
  uVar13 = uVar38;
  if (sVar28 < uVar38) {
    uVar13 = sVar28;
  }
  uVar40 = sVar28 & ringbuffer_mask;
  puVar2 = ringbuffer + uVar40;
  uVar31 = ringbuffer[uVar40];
  local_118 = (ulong)*(int *)&(hasher->common).extra;
  local_108 = 0x7e4;
  if ((sVar28 - local_118 < sVar28) &&
     (uVar18 = (ulong)((uint)(sVar28 - local_118) & uVar10), uVar31 == ringbuffer[uVar18])) {
    if (7 < uVar21) {
      uVar32 = uVar21 & 0xfffffffffffffff8;
      puVar29 = ringbuffer + uVar32 + uVar40;
      lVar33 = 0;
      uVar23 = 0;
LAB_0011d913:
      if (*(ulong *)(puVar2 + uVar23 * 8) == *(ulong *)(ringbuffer + uVar23 * 8 + uVar18))
      goto code_r0x0011d920;
      uVar32 = *(ulong *)(ringbuffer + uVar23 * 8 + uVar18) ^ *(ulong *)(puVar2 + uVar23 * 8);
      uVar18 = 0;
      if (uVar32 != 0) {
        for (; (uVar32 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
        }
      }
      uVar23 = (uVar18 >> 3 & 0x1fffffff) - lVar33;
      goto LAB_0011d955;
    }
    uVar32 = 0;
    puVar29 = puVar2;
LAB_0011e6a1:
    uVar34 = uVar21 & 7;
    uVar23 = uVar32;
    if (uVar34 != 0) {
      uVar37 = uVar32 | uVar34;
      do {
        uVar23 = uVar32;
        if (ringbuffer[uVar32 + uVar18] != *puVar29) break;
        puVar29 = puVar29 + 1;
        uVar32 = uVar32 + 1;
        uVar34 = uVar34 - 1;
        uVar23 = uVar37;
      } while (uVar34 != 0);
    }
LAB_0011d955:
    if ((uVar23 < 4) || (uVar18 = uVar23 * 0x87 + 0x78f, uVar18 < 0x7e5)) goto LAB_0011d980;
    uVar31 = puVar2[uVar23];
    local_108 = uVar18;
  }
  else {
LAB_0011d980:
    local_118 = 0;
    uVar23 = 0;
  }
  uVar16 = (uint)((ulong)(*(long *)(ringbuffer + uVar40) * 0x35a7bd1e35a7bd00) >> 0x2c);
  lVar19 = 0;
  lVar33 = 0;
  lVar42 = 1;
  do {
    auStack_58[lVar19] = lVar33 * 8 + (ulong)uVar16 & 0xfffff;
    auStack_58[lVar19 + 1] = lVar42 * 8 + (ulong)uVar16 & 0xfffff;
    lVar19 = lVar19 + 2;
    lVar33 = lVar33 + 2;
    lVar42 = lVar42 + 2;
  } while (lVar19 != 4);
  uVar16 = (uint)sVar28;
  uVar18 = (ulong)((uint)uVar21 & 7);
  uVar32 = uVar21 & 0xfffffffffffffff8;
  lVar33 = 0;
  do {
    uVar17 = *(uint *)(lVar9 + auStack_58[lVar33] * 4);
    uVar15 = uVar10 & uVar17;
    if (((uVar31 == ringbuffer[uVar23 + uVar15]) && (sVar28 != uVar17)) &&
       (uVar34 = sVar28 - uVar17, uVar34 <= uVar13)) {
      if (7 < uVar21) {
        lVar42 = 0;
        uVar37 = 0;
LAB_0011da5a:
        if (*(ulong *)(puVar2 + uVar37 * 8) == *(ulong *)(ringbuffer + uVar37 * 8 + (ulong)uVar15))
        goto code_r0x0011da67;
        uVar36 = *(ulong *)(ringbuffer + uVar37 * 8 + (ulong)uVar15) ^
                 *(ulong *)(puVar2 + uVar37 * 8);
        uVar37 = 0;
        if (uVar36 != 0) {
          for (; (uVar36 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
          }
        }
        uVar37 = (uVar37 >> 3 & 0x1fffffff) - lVar42;
        goto LAB_0011da8d;
      }
      puVar29 = puVar2;
      uVar36 = 0;
LAB_0011dad5:
      uVar37 = uVar36;
      if (uVar18 != 0) {
        uVar24 = uVar18 | uVar36;
        uVar25 = uVar18;
        do {
          uVar37 = uVar36;
          if (ringbuffer[uVar36 + uVar15] != *puVar29) break;
          puVar29 = puVar29 + 1;
          uVar36 = uVar36 + 1;
          uVar25 = uVar25 - 1;
          uVar37 = uVar24;
        } while (uVar25 != 0);
      }
LAB_0011da8d:
      if (3 < uVar37) {
        iVar12 = 0x1f;
        if ((uint)uVar34 != 0) {
          for (; (uint)uVar34 >> iVar12 == 0; iVar12 = iVar12 + -1) {
          }
        }
        uVar36 = (ulong)(iVar12 * -0x1e + 0x780) + uVar37 * 0x87;
        if (local_108 < uVar36) {
          uVar31 = puVar2[uVar37];
          local_118 = uVar34;
          uVar23 = uVar37;
          local_108 = uVar36;
        }
      }
    }
    lVar33 = lVar33 + 1;
  } while (lVar33 != 4);
  *(uint *)(lVar9 + *(long *)((long)auStack_58 + (ulong)(uVar16 & 0x18)) * 4) = uVar16;
  if (0x1f < uVar21 && (sVar28 & 3) == 0) {
    uVar40 = (params->dist).max_distance;
    if (uVar40 <= sVar28) {
      uVar39 = (params->dist).distance_postfix_bits;
      iVar12 = *(int *)((long)&(params->dictionary).words + 4);
      uVar6 = (params->dictionary).num_transforms;
LAB_0011db92:
      uVar17 = uVar39 & 0x3fffffff;
      bVar14 = ringbuffer[uVar40 & ringbuffer_mask];
      bVar5 = ringbuffer[uVar40 + 0x20 & ringbuffer_mask];
      if (uVar17 < 0x1000000) {
        lVar33 = *(long *)&(params->dist).alphabet_size_max;
        uVar15 = *(uint *)(lVar33 + (ulong)uVar17 * 4);
        *(int *)(lVar33 + (ulong)uVar17 * 4) = (int)uVar40;
        if ((uVar40 == sVar28) && (uVar15 != 0xffffffff)) {
          uVar17 = uVar16 - uVar15;
          if (uVar17 <= uVar13) {
            lVar33 = 0;
            uVar34 = 0;
LAB_0011dc19:
            if (*(ulong *)(puVar2 + uVar34 * 8) ==
                *(ulong *)(ringbuffer + uVar34 * 8 + (ulong)(uVar15 & uVar10)))
            goto code_r0x0011dc26;
            uVar37 = *(ulong *)(ringbuffer + uVar34 * 8 + (ulong)(uVar15 & uVar10)) ^
                     *(ulong *)(puVar2 + uVar34 * 8);
            uVar34 = 0;
            if (uVar37 != 0) {
              for (; (uVar37 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
              }
            }
            uVar37 = (uVar34 >> 3 & 0x1fffffff) - lVar33;
            goto LAB_0011dc72;
          }
        }
      }
      goto LAB_0011dbe6;
    }
    goto LAB_0011dce4;
  }
  goto LAB_0011dcec;
code_r0x0011d920:
  uVar23 = uVar23 + 1;
  lVar33 = lVar33 + -8;
  if (uVar21 >> 3 == uVar23) goto LAB_0011e6a1;
  goto LAB_0011d913;
code_r0x0011da67:
  uVar37 = uVar37 + 1;
  lVar42 = lVar42 + -8;
  puVar29 = ringbuffer + uVar32 + uVar40;
  uVar36 = uVar32;
  if (uVar21 >> 3 == uVar37) goto LAB_0011dad5;
  goto LAB_0011da5a;
code_r0x0011dc26:
  uVar34 = uVar34 + 1;
  lVar33 = lVar33 + -8;
  uVar37 = uVar32;
  uVar36 = uVar32;
  uVar25 = uVar18;
  if (uVar21 >> 3 == uVar34) goto joined_r0x0011dc3f;
  goto LAB_0011dc19;
joined_r0x0011dc3f:
  for (; (uVar25 != 0 && (uVar37 = uVar36, ringbuffer[uVar36 + (uVar15 & uVar10)] == puVar2[uVar36])
         ); uVar36 = uVar36 + 1) {
    uVar37 = uVar21;
    uVar25 = uVar25 - 1;
  }
LAB_0011dc72:
  if ((3 < uVar37) && (uVar23 < uVar37)) {
    iVar22 = 0x1f;
    if (uVar17 != 0) {
      for (; uVar17 >> iVar22 == 0; iVar22 = iVar22 + -1) {
      }
    }
    uVar34 = (ulong)(iVar22 * -0x1e + 0x780) + uVar37 * 0x87;
    if (local_108 < uVar34) {
      uVar23 = uVar37;
      local_118 = (ulong)uVar17;
      local_108 = uVar34;
    }
  }
LAB_0011dbe6:
  uVar39 = ~(uint)bVar14 * uVar6 + (uint)bVar5 + uVar39 * iVar12 + 1;
  uVar40 = uVar40 + 4;
  if (sVar28 < uVar40) goto LAB_0011dcbd;
  goto LAB_0011db92;
LAB_0011dcbd:
  (params->dist).distance_postfix_bits = uVar39;
LAB_0011dce4:
  (params->dist).max_distance = sVar28 + 4;
LAB_0011dcec:
  if (0x7e4 < local_108) {
    uVar13 = (ulong)*(int *)&(hasher->common).extra;
    uVar40 = local_110 + 4;
    uVar18 = (lVar3 + num_bytes) - sVar28;
    iVar12 = 0;
LAB_0011dd33:
    uVar34 = uVar18 >> 3;
    uVar21 = uVar21 - 1;
    uVar32 = uVar23 - 1;
    if (uVar21 <= uVar23 - 1) {
      uVar32 = uVar21;
    }
    if (4 < *(int *)(literal_context_lut + 4)) {
      uVar32 = 0;
    }
    uVar37 = sVar28 + 1;
    uVar36 = uVar38;
    if (uVar37 < uVar38) {
      uVar36 = uVar37;
    }
    puVar2 = ringbuffer + (uVar37 & ringbuffer_mask);
    uVar31 = puVar2[uVar32];
    uVar25 = uVar37 - uVar13;
    local_120 = 0x7e4;
    if ((uVar25 < uVar37) && (uVar16 = (uint)uVar25 & uVar10, uVar31 == ringbuffer[uVar32 + uVar16])
       ) {
      if (7 < uVar21) {
        lVar33 = 0;
        uVar25 = 0;
LAB_0011ddc5:
        if (*(ulong *)(puVar2 + uVar25 * 8) == *(ulong *)(ringbuffer + uVar25 * 8 + (ulong)uVar16))
        goto code_r0x0011ddd2;
        uVar24 = *(ulong *)(ringbuffer + uVar25 * 8 + (ulong)uVar16) ^
                 *(ulong *)(puVar2 + uVar25 * 8);
        uVar25 = 0;
        if (uVar24 != 0) {
          for (; (uVar24 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
          }
        }
        local_140 = (uVar25 >> 3 & 0x1fffffff) - lVar33;
        goto LAB_0011de09;
      }
      local_140 = 0;
      puVar29 = puVar2;
      goto LAB_0011e210;
    }
    goto LAB_0011de4a;
  }
  local_110 = local_110 + 1;
  position = sVar28 + 1;
  if ((num_literals == (size_t *)0x0) && (local_c8 < position)) {
    if ((uint)((int)lVar41 * 4) + local_c8 < position) {
      uVar13 = sVar28 + 0x11;
      if (uVar4 <= sVar28 + 0x11) {
        uVar13 = uVar4;
      }
      for (; position < uVar13; position = position + 4) {
        *(uint *)(lVar9 + (ulong)((uint)((ulong)(*(long *)(ringbuffer + (position & ringbuffer_mask)
                                                          ) * 0x35a7bd1e35a7bd00) >> 0x2c) +
                                  ((uint)position & 0x18) & 0xfffff) * 4) = (uint)position;
        local_110 = local_110 + 4;
      }
    }
    else {
      uVar13 = sVar28 + 9;
      if (uVar4 <= sVar28 + 9) {
        uVar13 = uVar4;
      }
      for (; position < uVar13; position = position + 2) {
        *(uint *)(lVar9 + (ulong)((uint)((ulong)(*(long *)(ringbuffer + (position & ringbuffer_mask)
                                                          ) * 0x35a7bd1e35a7bd00) >> 0x2c) +
                                  ((uint)position & 0x18) & 0xfffff) * 4) = (uint)position;
        local_110 = local_110 + 2;
      }
    }
  }
  goto LAB_0011e62e;
code_r0x0011ddd2:
  uVar25 = uVar25 + 1;
  lVar33 = lVar33 + -8;
  if (uVar34 == uVar25) goto code_r0x0011dde0;
  goto LAB_0011ddc5;
code_r0x0011dde0:
  local_140 = -lVar33;
  puVar29 = puVar2 + -lVar33;
LAB_0011e210:
  uVar25 = uVar21 & 7;
  for (; (uVar25 != 0 && (ringbuffer[local_140 + uVar16] == *puVar29)); local_140 = local_140 + 1) {
    puVar29 = puVar29 + 1;
    uVar25 = uVar25 - 1;
  }
LAB_0011de09:
  if (local_140 < 4) {
    local_f0 = 0;
    local_140 = 0;
  }
  else {
    uVar25 = local_140 * 0x87 + 0x78f;
    if (uVar25 < 0x7e5) {
LAB_0011de4a:
      local_f0 = 0;
      local_140 = 0;
    }
    else {
      uVar31 = puVar2[local_140];
      uVar32 = local_140;
      local_f0 = uVar13;
      local_120 = uVar25;
    }
  }
  uVar16 = (uint)((ulong)(*(long *)(ringbuffer + (uVar37 & ringbuffer_mask)) * 0x35a7bd1e35a7bd00)
                 >> 0x2c);
  lVar19 = 0;
  lVar33 = 0;
  lVar42 = 1;
  do {
    auStack_58[lVar19] = lVar33 * 8 + (ulong)uVar16 & 0xfffff;
    auStack_58[lVar19 + 1] = lVar42 * 8 + (ulong)uVar16 & 0xfffff;
    lVar19 = lVar19 + 2;
    lVar33 = lVar33 + 2;
    lVar42 = lVar42 + 2;
  } while (lVar19 != 4);
  uVar16 = (uint)uVar37;
  uVar25 = (ulong)((uint)uVar21 & 7);
  lVar33 = 0;
LAB_0011deb9:
  uVar17 = *(uint *)(lVar9 + auStack_58[lVar33] * 4);
  uVar15 = uVar10 & uVar17;
  if (((uVar31 == ringbuffer[uVar32 + uVar15]) && (uVar37 != uVar17)) &&
     (uVar24 = uVar37 - uVar17, uVar24 <= uVar36)) {
    uVar20 = uVar25;
    if (7 < uVar21) {
      lVar42 = 0;
      uVar30 = 0;
LAB_0011df00:
      if (*(ulong *)(puVar2 + uVar30 * 8) == *(ulong *)(ringbuffer + uVar30 * 8 + (ulong)uVar15))
      goto code_r0x0011df0d;
      uVar30 = *(ulong *)(ringbuffer + uVar30 * 8 + (ulong)uVar15) ^ *(ulong *)(puVar2 + uVar30 * 8)
      ;
      uVar20 = 0;
      if (uVar30 != 0) {
        for (; (uVar30 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
        }
      }
      uVar30 = (uVar20 >> 3 & 0x1fffffff) - lVar42;
      goto LAB_0011df40;
    }
    uVar30 = 0;
    puVar29 = puVar2;
    goto joined_r0x0011dfaa;
  }
  goto LAB_0011df8e;
code_r0x0011df0d:
  uVar30 = uVar30 + 1;
  lVar42 = lVar42 + -8;
  if (uVar34 == uVar30) goto code_r0x0011df1b;
  goto LAB_0011df00;
code_r0x0011df1b:
  uVar30 = -lVar42;
  puVar29 = puVar2 + -lVar42;
joined_r0x0011dfaa:
  for (; (uVar20 != 0 && (ringbuffer[uVar30 + uVar15] == *puVar29)); uVar30 = uVar30 + 1) {
    uVar20 = uVar20 - 1;
    puVar29 = puVar29 + 1;
  }
LAB_0011df40:
  if (3 < uVar30) {
    iVar22 = 0x1f;
    if ((uint)uVar24 != 0) {
      for (; (uint)uVar24 >> iVar22 == 0; iVar22 = iVar22 + -1) {
      }
    }
    uVar20 = (ulong)(iVar22 * -0x1e + 0x780) + uVar30 * 0x87;
    if (local_120 < uVar20) {
      uVar31 = puVar2[uVar30];
      uVar32 = uVar30;
      local_f0 = uVar24;
      local_140 = uVar30;
      local_120 = uVar20;
    }
  }
LAB_0011df8e:
  lVar33 = lVar33 + 1;
  if (lVar33 == 4) goto LAB_0011dfc4;
  goto LAB_0011deb9;
LAB_0011dfc4:
  *(uint *)(lVar9 + *(long *)((long)auStack_58 + (ulong)(uVar16 & 0x18)) * 4) = uVar16;
  if (uVar21 < 0x20 || (uVar37 & 3) != 0) goto LAB_0011e196;
  uVar32 = (params->dist).max_distance;
  if (uVar32 <= uVar37) {
    uVar17 = (params->dist).distance_postfix_bits;
    iVar22 = *(int *)((long)&(params->dictionary).words + 4);
    uVar39 = (params->dictionary).num_transforms;
LAB_0011e036:
    uVar15 = uVar17 & 0x3fffffff;
    bVar14 = ringbuffer[uVar32 & ringbuffer_mask];
    bVar5 = ringbuffer[uVar32 + 0x20 & ringbuffer_mask];
    if (uVar15 < 0x1000000) {
      lVar33 = *(long *)&(params->dist).alphabet_size_max;
      uVar7 = *(uint *)(lVar33 + (ulong)uVar15 * 4);
      *(int *)(lVar33 + (ulong)uVar15 * 4) = (int)uVar32;
      if ((uVar32 == uVar37) && (uVar7 != 0xffffffff)) {
        uVar15 = uVar16 - uVar7;
        if (uVar15 <= uVar36) {
          lVar33 = 0;
          uVar24 = 0;
LAB_0011e0bf:
          if (*(ulong *)(puVar2 + uVar24 * 8) ==
              *(ulong *)(ringbuffer + uVar24 * 8 + (ulong)(uVar7 & uVar10))) goto code_r0x0011e0cc;
          uVar20 = *(ulong *)(ringbuffer + uVar24 * 8 + (ulong)(uVar7 & uVar10)) ^
                   *(ulong *)(puVar2 + uVar24 * 8);
          uVar24 = 0;
          if (uVar20 != 0) {
            for (; (uVar20 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
            }
          }
          uVar24 = (uVar24 >> 3 & 0x1fffffff) - lVar33;
          goto LAB_0011e118;
        }
      }
    }
    goto LAB_0011e085;
  }
  goto LAB_0011e184;
code_r0x0011e0cc:
  uVar24 = uVar24 + 1;
  lVar33 = lVar33 + -8;
  if (uVar34 == uVar24) goto code_r0x0011e0da;
  goto LAB_0011e0bf;
code_r0x0011e0da:
  uVar20 = uVar25;
  for (uVar24 = -lVar33; (uVar20 != 0 && (ringbuffer[uVar24 + (uVar7 & uVar10)] == puVar2[uVar24]));
      uVar24 = uVar24 + 1) {
    uVar20 = uVar20 - 1;
  }
LAB_0011e118:
  if ((3 < uVar24) && (local_140 < uVar24)) {
    iVar27 = 0x1f;
    if (uVar15 != 0) {
      for (; uVar15 >> iVar27 == 0; iVar27 = iVar27 + -1) {
      }
    }
    uVar20 = (ulong)(iVar27 * -0x1e + 0x780) + uVar24 * 0x87;
    if (local_120 < uVar20) {
      local_140 = uVar24;
      local_120 = uVar20;
      local_f0 = (ulong)uVar15;
    }
  }
LAB_0011e085:
  uVar17 = ~(uint)bVar14 * uVar39 + (uint)bVar5 + uVar17 * iVar22 + 1;
  uVar32 = uVar32 + 4;
  if (uVar37 < uVar32) goto LAB_0011e167;
  goto LAB_0011e036;
LAB_0011e167:
  (params->dist).distance_postfix_bits = uVar17;
LAB_0011e184:
  (params->dist).max_distance = sVar28 + 5;
LAB_0011e196:
  uVar32 = sVar28;
  uVar34 = local_110;
  if ((local_120 < local_108 + 0xaf) ||
     (uVar23 = local_140, uVar32 = uVar37, local_118 = local_f0, uVar34 = uVar40, iVar12 == 3))
  goto LAB_0011e2db;
  local_110 = local_110 + 1;
  iVar12 = iVar12 + 1;
  uVar36 = sVar28 + 9;
  uVar18 = uVar18 - 1;
  local_108 = local_120;
  sVar28 = uVar37;
  uVar34 = local_110;
  if (uVar1 <= uVar36) goto LAB_0011e2db;
  goto LAB_0011dd33;
LAB_0011e2db:
  local_110 = uVar34;
  uVar13 = lVar8 + uVar32;
  if (uVar38 <= lVar8 + uVar32) {
    uVar13 = uVar38;
  }
  iVar22 = (int)uVar23;
  iVar12 = (int)local_110;
  if (uVar13 < local_118) {
LAB_0011e2fc:
    uVar40 = local_118 + 0xf;
LAB_0011e300:
    if ((local_118 <= uVar13) && (uVar40 != 0)) {
      *(int *)((long)&(hasher->common).dict_num_lookups + 4) =
           (int)(hasher->common).dict_num_lookups;
      *(void **)((long)&(hasher->common).extra + 4) = (hasher->common).extra;
      *(int *)&(hasher->common).extra = (int)local_118;
    }
    *(int *)local_100 = iVar12;
    *(int *)((long)local_100 + 4) = iVar22;
    uVar13 = (ulong)*(uint *)(literal_context_lut + 0x44) + 0x10;
    iVar27 = 0;
    if (uVar13 <= uVar40) {
      bVar14 = (byte)*(uint *)(literal_context_lut + 0x40);
      uVar21 = ((uVar40 - *(uint *)(literal_context_lut + 0x44)) + (4L << (bVar14 & 0x3f))) - 0x10;
      uVar16 = 0x1f;
      uVar17 = (uint)uVar21;
      if (uVar17 != 0) {
        for (; uVar17 >> uVar16 == 0; uVar16 = uVar16 - 1) {
        }
      }
      uVar16 = (uVar16 ^ 0xffffffe0) + 0x1f;
      uVar18 = (ulong)((uVar21 >> ((ulong)uVar16 & 0x3f) & 1) != 0);
      lVar33 = (ulong)uVar16 - (ulong)*(uint *)(literal_context_lut + 0x40);
      uVar40 = (~(-1 << (bVar14 & 0x1f)) & uVar17) + uVar13 +
               (uVar18 + lVar33 * 2 + 0xfffe << (bVar14 & 0x3f)) | lVar33 * 0x400;
      iVar27 = (int)(uVar21 - (uVar18 + 2 << ((byte)uVar16 & 0x3f)) >> (bVar14 & 0x3f));
    }
    uVar16 = (uint)uVar40;
  }
  else {
    uVar21 = (ulong)*(int *)&(hasher->common).extra;
    if (local_118 != uVar21) {
      uVar18 = (ulong)*(int *)((long)&(hasher->common).extra + 4);
      uVar40 = 1;
      if (local_118 != uVar18) {
        uVar21 = (local_118 + 3) - uVar21;
        if (uVar21 < 7) {
          bVar14 = (byte)((int)uVar21 << 2);
          uVar16 = 0x9750468;
        }
        else {
          uVar18 = (local_118 + 3) - uVar18;
          if (6 < uVar18) {
            uVar40 = 2;
            if ((local_118 != (long)(int)(hasher->common).dict_num_lookups) &&
               (uVar40 = 3,
               local_118 != (long)*(int *)((long)&(hasher->common).dict_num_lookups + 4)))
            goto LAB_0011e2fc;
            goto LAB_0011e300;
          }
          bVar14 = (byte)((int)uVar18 << 2);
          uVar16 = 0xfdb1ace;
        }
        uVar40 = (ulong)(uVar16 >> (bVar14 & 0x1f) & 0xf);
      }
      goto LAB_0011e300;
    }
    *(int *)local_100 = iVar12;
    *(int *)((long)local_100 + 4) = iVar22;
    uVar16 = 0;
    iVar27 = 0;
  }
  *(short *)((long)local_100 + 0xe) = (short)uVar16;
  *(int *)(local_100 + 1) = iVar27;
  if (local_110 < 6) {
    uVar13 = local_110 & 0xffffffff;
  }
  else if (local_110 < 0x82) {
    uVar17 = 0x1f;
    uVar15 = (uint)(local_110 - 2);
    if (uVar15 != 0) {
      for (; uVar15 >> uVar17 == 0; uVar17 = uVar17 - 1) {
      }
    }
    uVar13 = (ulong)((int)(local_110 - 2 >> ((char)(uVar17 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                     (uVar17 ^ 0xffffffe0) * 2 + 0x40);
  }
  else if (local_110 < 0x842) {
    uVar17 = 0x1f;
    if (iVar12 - 0x42U != 0) {
      for (; iVar12 - 0x42U >> uVar17 == 0; uVar17 = uVar17 - 1) {
      }
    }
    uVar13 = (ulong)((uVar17 ^ 0xffe0) + 0x2a);
  }
  else {
    uVar13 = 0x15;
    if (0x1841 < local_110) {
      uVar13 = (ulong)(ushort)(0x17 - (local_110 < 0x5842));
    }
  }
  uVar21 = (ulong)iVar22;
  if (uVar21 < 10) {
    uVar17 = iVar22 - 2;
  }
  else if (uVar21 < 0x86) {
    uVar17 = 0x1f;
    uVar15 = (uint)(uVar21 - 6);
    if (uVar15 != 0) {
      for (; uVar15 >> uVar17 == 0; uVar17 = uVar17 - 1) {
      }
    }
    uVar17 = (int)(uVar21 - 6 >> ((char)(uVar17 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
             (uVar17 ^ 0xffffffe0) * 2 + 0x42;
  }
  else {
    uVar17 = 0x17;
    if (uVar21 < 0x846) {
      uVar17 = 0x1f;
      if (iVar22 - 0x46U != 0) {
        for (; iVar22 - 0x46U >> uVar17 == 0; uVar17 = uVar17 - 1) {
        }
      }
      uVar17 = (uVar17 ^ 0xffe0) + 0x2c;
    }
  }
  uVar11 = (ushort)uVar17;
  uVar26 = (uVar11 & 7) + ((ushort)uVar13 & 7) * 8;
  if ((((uVar16 & 0x3ff) == 0) && ((ushort)uVar13 < 8)) && (uVar11 < 0x10)) {
    if (7 < uVar11) {
      uVar26 = uVar26 | 0x40;
    }
  }
  else {
    iVar12 = (int)((uVar13 & 0xffff) >> 3) * 3 + ((uVar17 & 0xffff) >> 3);
    uVar26 = uVar26 + ((ushort)(0x520d40 >> ((char)iVar12 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar12 * 0x40 + 0x40;
  }
  *(ushort *)((long)local_100 + 0xc) = uVar26;
  *num_commands = *num_commands + local_110;
  position = uVar23 + uVar32;
  uVar13 = sVar35;
  if (position < sVar35) {
    uVar13 = position;
  }
  uVar21 = uVar32 + 2;
  if (local_118 < uVar23 >> 2) {
    uVar40 = position + local_118 * -4;
    if (uVar40 < uVar21) {
      uVar40 = uVar21;
    }
    uVar21 = uVar40;
    if (uVar13 < uVar40) {
      uVar21 = uVar13;
    }
  }
  local_c8 = uVar23 * 2 + uVar32 + lVar41;
  local_100 = local_100 + 2;
  if (uVar21 < uVar13) {
    do {
      *(uint *)(lVar9 + (ulong)((uint)((ulong)(*(long *)(ringbuffer + (uVar21 & ringbuffer_mask)) *
                                              0x35a7bd1e35a7bd00) >> 0x2c) + ((uint)uVar21 & 0x18) &
                               0xfffff) * 4) = (uint)uVar21;
      uVar21 = uVar21 + 1;
    } while (uVar13 != uVar21);
  }
  local_110 = 0;
LAB_0011e62e:
  sVar28 = position;
  if (uVar1 <= position + 8) goto LAB_0011e6e7;
  goto LAB_0011d882;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals,
    const BackwardReferenceFromDecoder* backward_references,
    size_t* back_refs_position, size_t back_refs_size) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  BROTLI_UNUSED(literal_context_lut);

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    sr.used_stored = BROTLI_FALSE;
    FN(FindLongestMatch)(privat, &params->dictionary,
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance,
        backward_references, back_refs_position, back_refs_size, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      /* If a reference from backward_references array was found
         then just take it */
      if (!sr.used_stored) {
          for (;; --max_length) {
            const score_t cost_diff_lazy = 175;
            HasherSearchResult sr2;
            sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
                BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
            sr2.len_code_delta = 0;
            sr2.distance = 0;
            sr2.score = kMinScore;
            sr2.used_stored = BROTLI_FALSE;
            max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
            dictionary_start = BROTLI_MIN(size_t,
                position + 1 + position_offset, max_backward_limit);
            FN(FindLongestMatch)(privat,
                &params->dictionary,
                ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
                max_distance, dictionary_start + gap, params->dist.max_distance,
                backward_references, back_refs_position, back_refs_size, &sr2);
            if (sr2.score >= sr.score + cost_diff_lazy || sr2.used_stored) {
              /* Ok, let's just write one byte for now and start a match from the
                 next byte. */
              ++position;
              ++insert_length;
              sr = sr2;
              /* If a reference from backward_references array was found
                 then just take it */
              if (sr2.used_stored) {
                ++delayed_backward_references_in_row;
                break;
              }
              if (++delayed_backward_references_in_row < 4 &&
                  position + FN(HashTypeLength)() < pos_end) {
                continue;
              }
            }
            break;
          }
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics && back_refs_size == 0) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}